

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O3

void __thiscall tinyusdz::usdc::USDCReader::Impl::~Impl(Impl *this)

{
  CrateReader *this_00;
  pointer pIVar1;
  pointer pFVar2;
  pointer pSVar3;
  pointer pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  
  this_00 = this->crate_reader;
  if (this_00 != (CrateReader *)0x0) {
    crate::CrateReader::~CrateReader(this_00);
  }
  operator_delete(this_00,0x270);
  this->crate_reader = (CrateReader *)0x0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase(&(this->_supported_prim_attr_types)._M_t,
             (_Link_type)
             (this->_supported_prim_attr_types)._M_t._M_impl.super__Rb_tree_header._M_header.
             _M_parent);
  ::std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase
            (&(this->_prim_table)._M_t,
             (_Link_type)(this->_prim_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent)
  ;
  ::std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::_M_erase(&(this->_variantPropChildren)._M_t,
             (_Link_type)
             (this->_variantPropChildren)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  ::std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::_M_erase(&(this->_variantPrimChildren)._M_t,
             (_Link_type)
             (this->_variantPrimChildren)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  ::std::
  _Rb_tree<int,_std::pair<const_int,_tinyusdz::Variant>,_std::_Select1st<std::pair<const_int,_tinyusdz::Variant>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Variant>_>_>
  ::_M_erase(&(this->_variants)._M_t,
             (_Link_type)(this->_variants)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  ::std::
  _Rb_tree<int,_std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>,_std::_Select1st<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
  ::_M_erase(&(this->_variantProps)._M_t,
             (_Link_type)
             (this->_variantProps)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  ::std::
  _Rb_tree<int,_std::pair<const_int,_tinyusdz::PrimSpec>,_std::_Select1st<std::pair<const_int,_tinyusdz::PrimSpec>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
  ::_M_erase(&(this->_variantPrimSpecs)._M_t,
             (_Link_type)
             (this->_variantPrimSpecs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  ::std::
  _Rb_tree<int,_std::pair<const_int,_tinyusdz::Prim>,_std::_Select1st<std::pair<const_int,_tinyusdz::Prim>_>,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::Prim>_>_>
  ::_M_erase(&(this->_variantPrims)._M_t,
             (_Link_type)
             (this->_variantPrims)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  ::std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>_>_>
  ::_M_erase(&(this->_variantChildren)._M_t,
             (_Link_type)
             (this->_variantChildren)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  ::std::
  _Rb_tree<tinyusdz::crate::Index,_std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>,_std::_Select1st<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>,_std::less<tinyusdz::crate::Index>,_std::allocator<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>_>
  ::_M_erase(&(this->_live_fieldsets)._M_t,
             (_Link_type)
             (this->_live_fieldsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&this->_elemPaths);
  ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector(&this->_paths);
  pIVar1 = (this->_string_indices).
           super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pIVar1 != (pointer)0x0) {
    operator_delete(pIVar1,(long)(this->_string_indices).
                                 super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pIVar1);
  }
  pIVar1 = (this->_fieldset_indices).
           super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pIVar1 != (pointer)0x0) {
    operator_delete(pIVar1,(long)(this->_fieldset_indices).
                                 super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pIVar1);
  }
  pFVar2 = (this->_fields).
           super__Vector_base<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pFVar2 != (pointer)0x0) {
    operator_delete(pFVar2,(long)(this->_fields).
                                 super__Vector_base<tinyusdz::crate::Field,_std::allocator<tinyusdz::crate::Field>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pFVar2);
  }
  pSVar3 = (this->_specs).
           super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pSVar3 != (pointer)0x0) {
    operator_delete(pSVar3,(long)(this->_specs).
                                 super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar3);
  }
  ::std::
  vector<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>::
  ~vector(&this->_nodes);
  pcVar4 = (this->_warn)._M_dataplus._M_p;
  paVar5 = &(this->_warn).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar5) {
    operator_delete(pcVar4,paVar5->_M_allocated_capacity + 1);
  }
  pcVar4 = (this->_err)._M_dataplus._M_p;
  paVar5 = &(this->_err).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != paVar5) {
    operator_delete(pcVar4,paVar5->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~Impl() {
    delete crate_reader;
    crate_reader = nullptr;
  }